

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O3

void __thiscall FListMenuItemPlayerDisplay::Ticker(FListMenuItemPlayerDisplay *this)

{
  FState *pFVar1;
  uint uVar2;
  int iVar3;
  
  if (this->mClassNum < 0) {
    UpdateRandomClass(this);
  }
  pFVar1 = this->mPlayerState;
  if (pFVar1 != (FState *)0x0) {
    iVar3 = (int)pFVar1->Tics;
    if (pFVar1->TicRange != 0) {
      uVar2 = FRandom::GenRand32(&FState::pr_statetics);
      iVar3 = iVar3 + uVar2 % (pFVar1->TicRange + 1);
    }
    if (((iVar3 != -1) && (pFVar1 = this->mPlayerState->NextState, pFVar1 != (FState *)0x0)) &&
       (iVar3 = this->mPlayerTics, this->mPlayerTics = iVar3 + -1, iVar3 < 2)) {
      this->mPlayerState = pFVar1;
      iVar3 = (int)pFVar1->Tics;
      if (pFVar1->TicRange != 0) {
        uVar2 = FRandom::GenRand32(&FState::pr_statetics);
        iVar3 = iVar3 + uVar2 % (pFVar1->TicRange + 1);
      }
      this->mPlayerTics = iVar3;
    }
  }
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::Ticker()
{
	if (mClassNum < 0) UpdateRandomClass();

	if (mPlayerState != NULL && mPlayerState->GetTics () != -1 && mPlayerState->GetNextState () != NULL)
	{
		if (--mPlayerTics <= 0)
		{
			mPlayerState = mPlayerState->GetNextState();
			mPlayerTics = mPlayerState->GetTics();
		}
	}
}